

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_loadhostpairs(Curl_easy *data)

{
  bool bVar1;
  Curl_addrinfo *pCVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  Curl_addrinfo *pCVar7;
  Curl_addrinfo *ai;
  size_t alen;
  _Bool error;
  unsigned_long tmp_port;
  char *host_end;
  char *end_ptr;
  char *port_ptr;
  char *addr_end;
  char *addr_begin;
  char *addresses;
  char address [64];
  size_t entry_len_1;
  char *entry_id_1;
  Curl_addrinfo *tail;
  Curl_addrinfo *head;
  Curl_dns_entry *dns;
  size_t entry_len;
  char *entry_id;
  char local_128 [4];
  int port;
  char hostname [256];
  curl_slist *local_20;
  curl_slist *hostp;
  Curl_easy *data_local;
  
  entry_id._4_4_ = 0;
  local_20 = (data->change).resolve;
  do {
    if (local_20 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    if (local_20->data != (char *)0x0) {
      if (*local_20->data == '-') {
        iVar3 = __isoc99_sscanf(local_20->data + 1,"%255[^:]:%d",local_128,(long)&entry_id + 4);
        if (iVar3 == 2) {
          pcVar4 = create_hostcache_id(local_128,entry_id._4_4_);
          if (pcVar4 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          sVar5 = strlen(pcVar4);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          Curl_hash_delete((data->dns).hostcache,pcVar4,sVar5 + 1);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          (*Curl_cfree)(pcVar4);
        }
        else {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE removal entry \'%s\'!\n",local_20->data);
        }
      }
      else {
        tail = (Curl_addrinfo *)0x0;
        entry_id_1 = (char *)0x0;
        addr_begin = (char *)0x0;
        bVar1 = true;
        pcVar4 = strchr(local_20->data,0x3a);
        if ((pcVar4 != (char *)0x0) && ((long)pcVar4 - (long)local_20->data < 0x100)) {
          memcpy(local_128,local_20->data,(long)pcVar4 - (long)local_20->data);
          pcVar4[(long)(local_128 + -(long)local_20->data)] = '\0';
          end_ptr = pcVar4 + 1;
          uVar6 = strtoul(end_ptr,&host_end,10);
          if ((uVar6 < 0x10000) && ((host_end != end_ptr && (*host_end == ':')))) {
            entry_id._4_4_ = (uint)uVar6;
            addr_begin = host_end + 1;
            pCVar7 = (Curl_addrinfo *)entry_id_1;
            pCVar2 = tail;
            while (tail = pCVar2, entry_id_1 = (char *)pCVar7, *host_end != '\0') {
              addr_end = host_end + 1;
              port_ptr = strchr(addr_end,0x2c);
              pcVar4 = addr_end;
              if (port_ptr == (char *)0x0) {
                sVar5 = strlen(addr_end);
                port_ptr = pcVar4 + sVar5;
              }
              host_end = port_ptr;
              if (*addr_end == '[') {
                if ((port_ptr == addr_end) || (port_ptr[-1] != ']')) goto LAB_0010ca86;
                addr_end = addr_end + 1;
                port_ptr = port_ptr + -1;
              }
              uVar6 = (long)port_ptr - (long)addr_end;
              pCVar7 = (Curl_addrinfo *)entry_id_1;
              pCVar2 = tail;
              if (uVar6 != 0) {
                if (0x3f < uVar6) goto LAB_0010ca86;
                memcpy(&addresses,addr_end,uVar6);
                address[uVar6 - 8] = '\0';
                pCVar7 = Curl_str2addr((char *)&addresses,entry_id._4_4_);
                if (pCVar7 == (Curl_addrinfo *)0x0) {
                  Curl_infof(data,"Resolve address \'%s\' found illegal!\n",&addresses);
                  goto LAB_0010ca86;
                }
                pCVar2 = pCVar7;
                if (entry_id_1 != (char *)0x0) {
                  *(Curl_addrinfo **)(entry_id_1 + 0x28) = pCVar7;
                  pCVar7 = (Curl_addrinfo *)*(char **)(entry_id_1 + 0x28);
                  pCVar2 = tail;
                }
              }
            }
            if (tail != (Curl_addrinfo *)0x0) {
              bVar1 = false;
            }
          }
        }
LAB_0010ca86:
        if (bVar1) {
          Curl_infof(data,"Couldn\'t parse CURLOPT_RESOLVE entry \'%s\'!\n",local_20->data);
          Curl_freeaddrinfo(tail);
        }
        else {
          pcVar4 = create_hostcache_id(local_128,entry_id._4_4_);
          if (pcVar4 == (char *)0x0) {
            Curl_freeaddrinfo(tail);
            return CURLE_OUT_OF_MEMORY;
          }
          address._56_8_ = strlen(pcVar4);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
          }
          head = (Curl_addrinfo *)Curl_hash_pick((data->dns).hostcache,pcVar4,address._56_8_ + 1);
          (*Curl_cfree)(pcVar4);
          if (head == (Curl_addrinfo *)0x0) {
            head = (Curl_addrinfo *)Curl_cache_addr(data,tail,local_128,entry_id._4_4_);
            if (head != (Curl_addrinfo *)0x0) {
              *(time_t *)&head->ai_socktype = 0;
              *(long *)&head->ai_addrlen = *(long *)&head->ai_addrlen + -1;
            }
          }
          else {
            Curl_infof(data,"RESOLVE %s:%d is already cached, %s not stored!\n",local_128,
                       (ulong)entry_id._4_4_,addr_begin);
            Curl_freeaddrinfo(tail);
          }
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
          }
          if (head == (Curl_addrinfo *)0x0) {
            Curl_freeaddrinfo(tail);
            return CURLE_OUT_OF_MEMORY;
          }
          Curl_infof(data,"Added %s:%d:%s to DNS cache\n",local_128,(ulong)entry_id._4_4_,addr_begin
                    );
        }
      }
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct Curl_easy *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  int port = 0;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      char *entry_id;
      size_t entry_len;

      if(2 != sscanf(hostp->data + 1, "%255[^:]:%d", hostname, &port)) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE removal entry '%s'!\n",
              hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* delete entry, ignore if it didn't exist */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      /* free the allocated entry_id again */
      free(entry_id);
    }
    else {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *head = NULL, *tail = NULL;
      char *entry_id;
      size_t entry_len;
      char address[64];
      char *addresses = NULL;
      char *addr_begin;
      char *addr_end;
      char *port_ptr;
      char *end_ptr;
      char *host_end;
      unsigned long tmp_port;
      bool error = true;

      host_end = strchr(hostp->data, ':');
      if(!host_end ||
         ((host_end - hostp->data) >= (ptrdiff_t)sizeof(hostname)))
        goto err;

      memcpy(hostname, hostp->data, host_end - hostp->data);
      hostname[host_end - hostp->data] = '\0';

      port_ptr = host_end + 1;
      tmp_port = strtoul(port_ptr, &end_ptr, 10);
      if(tmp_port > USHRT_MAX || end_ptr == port_ptr || *end_ptr != ':')
        goto err;

      port = (int)tmp_port;
      addresses = end_ptr + 1;

      while(*end_ptr) {
        size_t alen;
        Curl_addrinfo *ai;

        addr_begin = end_ptr + 1;
        addr_end = strchr(addr_begin, ',');
        if(!addr_end)
          addr_end = addr_begin + strlen(addr_begin);
        end_ptr = addr_end;

        /* allow IP(v6) address within [brackets] */
        if(*addr_begin == '[') {
          if(addr_end == addr_begin || *(addr_end - 1) != ']')
            goto err;
          ++addr_begin;
          --addr_end;
        }

        alen = addr_end - addr_begin;
        if(!alen)
          continue;

        if(alen >= sizeof(address))
          goto err;

        memcpy(address, addr_begin, alen);
        address[alen] = '\0';

#ifndef ENABLE_IPV6
        if(strchr(address, ':')) {
          infof(data, "Ignoring resolve address '%s', missing IPv6 support.\n",
                address);
          continue;
        }
#endif

        ai = Curl_str2addr(address, port);
        if(!ai) {
          infof(data, "Resolve address '%s' found illegal!\n", address);
          goto err;
        }

        if(tail) {
          tail->ai_next = ai;
          tail = tail->ai_next;
        }
        else {
          head = tail = ai;
        }
      }

      if(!head)
        goto err;

      error = false;
   err:
      if(error) {
        infof(data, "Couldn't parse CURLOPT_RESOLVE entry '%s'!\n",
              hostp->data);
        Curl_freeaddrinfo(head);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns) {
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, head, hostname, port);
        if(dns) {
          dns->timestamp = 0; /* mark as added by CURLOPT_RESOLVE */
          /* release the returned reference; the cache itself will keep the
           * entry alive: */
          dns->inuse--;
        }
      }
      else {
        /* this is a duplicate, free it again */
        infof(data, "RESOLVE %s:%d is already cached, %s not stored!\n",
              hostname, port, addresses);
        Curl_freeaddrinfo(head);
      }

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(head);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, addresses);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}